

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O2

void __thiscall timing_registry::task_info::print(task_info *this)

{
  string msg;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)this);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::to_string(&local_50,this->duration_);
  std::__cxx11::string::append(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::to_string(&local_50,this->startedOnCore_);
  std::__cxx11::string::append(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::to_string(&local_50,this->stoppedOnCore_);
  std::__cxx11::string::append(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)local_30);
  std::operator<<((ostream *)&std::cout,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void print() const
        {
            std::string msg = name;
            msg += " took ";
            msg += std::to_string(duration_);
            msg += "ms, it started on core ";
            msg += std::to_string(startedOnCore_);
            msg += ", and stopped on core ";
            msg += std::to_string(stoppedOnCore_);
            msg += "\n";
            std::cout << msg;
        }